

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::cert_compression_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint16_t alg_id;
  Array<unsigned_short> given_alg_ids;
  CBS alg_ids;
  unsigned_short local_5a;
  Array<unsigned_short> local_58;
  ulong local_48;
  CBS local_40;
  
  if (contents == (CBS *)0x0) {
    return true;
  }
  _Var1._M_head_impl =
       (hs->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  uVar2 = *(size_t *)((long)&(_Var1._M_head_impl)->cert_compression_algs + 8);
  iVar7 = CBS_get_u8_length_prefixed(contents,&local_40);
  sVar4 = local_40.len;
  if (((iVar7 == 0) || (contents->len != 0)) || ((local_40.len & 1) != 0 || local_40.len == 0)) {
    return false;
  }
  local_48 = local_40.len >> 1;
  local_58.data_ = (unsigned_short *)0x0;
  local_58.size_ = 0;
  bVar5 = Array<unsigned_short>::InitUninitialized(&local_58,local_48);
  if (bVar5) {
    uVar9 = 0;
    uVar12 = uVar2;
    do {
      if (local_40.len == 0) {
        std::sort<unsigned_short*>(local_58.data_,local_58.data_ + local_58.size_);
        if (sVar4 < 3) goto LAB_0013b842;
        uVar9 = 0;
        goto LAB_0013b825;
      }
      iVar7 = CBS_get_u16(&local_40,&local_5a);
      uVar11 = uVar9;
      uVar10 = uVar12;
      if (iVar7 != 0) {
        if (local_58.size_ <= uVar9) goto LAB_0013b890;
        uVar11 = uVar9 + 1;
        local_58.data_[uVar9] = local_5a;
        if (uVar2 != 0) {
          lVar8 = 0x10;
          uVar9 = 0;
          do {
            if (*(size_t *)((long)&(_Var1._M_head_impl)->cert_compression_algs + 8) == uVar9)
            goto LAB_0013b890;
            lVar3 = (long)((_Var1._M_head_impl)->cert_compression_algs).data_;
            uVar10 = uVar9;
            if (uVar12 <= uVar9) {
              uVar10 = uVar12;
            }
            if (*(unsigned_short *)(lVar3 + lVar8) == local_5a &&
                *(long *)(lVar3 + -0x10 + lVar8) != 0) break;
            uVar9 = uVar9 + 1;
            lVar8 = lVar8 + 0x18;
            uVar10 = uVar12;
          } while (uVar9 < uVar2);
        }
      }
      uVar9 = uVar11;
      uVar12 = uVar10;
    } while (iVar7 != 0);
  }
LAB_0013b7c7:
  bVar5 = false;
  goto LAB_0013b7c9;
  while( true ) {
    if (local_58.data_[uVar9] == local_58.data_[uVar9 + 1]) goto LAB_0013b7c7;
    uVar9 = uVar9 + 1;
    if (local_48 - 1 == uVar9) break;
LAB_0013b825:
    if ((local_58.size_ == uVar9) || ((local_58.size_ - 1) + (ulong)(local_58.size_ == 0) == uVar9))
    goto LAB_0013b890;
  }
LAB_0013b842:
  bVar5 = true;
  if ((uVar12 < uVar2) && (uVar6 = ssl_protocol_version(hs->ssl), 0x303 < uVar6)) {
    hs->field_0x6ca = hs->field_0x6ca | 0x20;
    if (*(size_t *)((long)&(_Var1._M_head_impl)->cert_compression_algs + 8) <= uVar12) {
LAB_0013b890:
      abort();
    }
    hs->cert_compression_alg_id =
         *(uint16_t *)
          ((long)((_Var1._M_head_impl)->cert_compression_algs).data_ + 0x10 + uVar12 * 0x18);
  }
LAB_0013b7c9:
  OPENSSL_free(local_58.data_);
  return bVar5;
}

Assistant:

static bool cert_compression_parse_clienthello(SSL_HANDSHAKE *hs,
                                               uint8_t *out_alert,
                                               CBS *contents) {
  if (contents == nullptr) {
    return true;
  }

  const SSL_CTX *ctx = hs->ssl->ctx.get();
  const size_t num_algs = ctx->cert_compression_algs.size();

  CBS alg_ids;
  if (!CBS_get_u8_length_prefixed(contents, &alg_ids) ||  //
      CBS_len(contents) != 0 ||                           //
      CBS_len(&alg_ids) == 0 ||                           //
      CBS_len(&alg_ids) % 2 == 1) {
    return false;
  }

  const size_t num_given_alg_ids = CBS_len(&alg_ids) / 2;
  Array<uint16_t> given_alg_ids;
  if (!given_alg_ids.InitForOverwrite(num_given_alg_ids)) {
    return false;
  }

  size_t best_index = num_algs;
  size_t given_alg_idx = 0;

  while (CBS_len(&alg_ids) > 0) {
    uint16_t alg_id;
    if (!CBS_get_u16(&alg_ids, &alg_id)) {
      return false;
    }

    given_alg_ids[given_alg_idx++] = alg_id;

    for (size_t i = 0; i < num_algs; i++) {
      const auto &alg = ctx->cert_compression_algs[i];
      if (alg.alg_id == alg_id && alg.compress != nullptr) {
        if (i < best_index) {
          best_index = i;
        }
        break;
      }
    }
  }

  std::sort(given_alg_ids.begin(), given_alg_ids.end());
  for (size_t i = 1; i < num_given_alg_ids; i++) {
    if (given_alg_ids[i - 1] == given_alg_ids[i]) {
      return false;
    }
  }

  if (best_index < num_algs &&
      ssl_protocol_version(hs->ssl) >= TLS1_3_VERSION) {
    hs->cert_compression_negotiated = true;
    hs->cert_compression_alg_id = ctx->cert_compression_algs[best_index].alg_id;
  }

  return true;
}